

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginMenuBar(void)

{
  ImVec2 IVar1;
  ImGuiWindow *this;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  float fVar5;
  ImVec2 IVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  ImRect IVar12;
  ImVec2 local_18;
  ImVec2 IStack_10;
  
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if ((this->SkipItems == false) && ((this->Flags & 0x400) != 0)) {
    BeginGroup();
    PushID("##menubar");
    IVar12 = ImGuiWindow::MenuBarRect(this);
    fVar10 = this->WindowBorderSize;
    uVar3 = -(uint)(fVar10 <= this->WindowRounding);
    fVar5 = IVar12.Min.x;
    fVar11 = IVar12.Max.x - (float)(~uVar3 & (uint)fVar10 | (uint)this->WindowRounding & uVar3);
    uVar3 = -(uint)(fVar11 <= fVar5);
    auVar7._0_4_ = (float)(int)(fVar10 + fVar5 + 0.5);
    auVar7._4_4_ = (float)(int)(fVar10 + IVar12.Min.y + 0.5);
    auVar7._8_4_ = (float)(int)((float)(uVar3 & (uint)fVar5 | ~uVar3 & (uint)fVar11) + 0.5);
    auVar7._12_4_ = (float)(int)(IVar12.Max.y + 0.5);
    IVar1 = (this->OuterRectClipped).Min;
    fVar10 = IVar1.x;
    fVar11 = IVar1.y;
    uVar3 = -(uint)(fVar10 <= auVar7._0_4_);
    uVar4 = -(uint)(fVar11 <= auVar7._4_4_);
    IStack_10 = auVar7._8_8_;
    auVar8._8_4_ = IStack_10.x;
    auVar8._12_4_ = IStack_10.y;
    auVar8._0_4_ = IStack_10.x;
    auVar8._4_4_ = IStack_10.y;
    auVar9._8_8_ = 0;
    auVar9._0_4_ = (this->OuterRectClipped).Max.x;
    auVar9._4_4_ = (this->OuterRectClipped).Max.y;
    auVar9 = minps(auVar8,auVar9);
    IStack_10 = (ImVec2)auVar9._0_8_;
    local_18 = (ImVec2)(CONCAT44(~uVar4 & (uint)fVar11,~uVar3 & (uint)fVar10) |
                       CONCAT44((uint)auVar7._4_4_ & uVar4,(uint)auVar7._0_4_ & uVar3));
    PushClipRect(&local_18,&IStack_10,false);
    IVar1 = (this->DC).MenuBarOffset;
    IVar6.x = IVar1.x + fVar5;
    IVar6.y = IVar1.y + IVar12.Min.y;
    (this->DC).CursorMaxPos = IVar6;
    (this->DC).CursorPos = IVar6;
    (this->DC).LayoutType = 0;
    (this->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
    (this->DC).MenuBarAppending = true;
    AlignTextToFramePadding();
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}